

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamEuler::BuildBeam
          (ChBuilderBeamEuler *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionEuler> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeB,ChVector<double> *Ydir)

{
  element_type *peVar1;
  element_type *peVar2;
  ChMesh *pCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _func_int *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  ChNodeFEAxyzrot *pCVar12;
  pointer psVar13;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_01;
  ChVector<double> *mv;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  ChMatrix33<double> mrot;
  ChVector<double> v;
  shared_ptr<chrono::fea::ChElementBeamEuler> element;
  value_type local_348;
  ChNodeFEAxyzrot *local_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_330 [2];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_320;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_318;
  shared_ptr<chrono::fea::ChMesh> *local_310;
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  element_type *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_258;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_240;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_230;
  shared_ptr<chrono::fea::ChElementBase> local_228;
  element_type *local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_208;
  ulong local_200;
  ulong local_1f8;
  double local_1f0;
  ChBuilderBeamEuler *local_1e8;
  ChMatrix33<double> local_1e0;
  undefined1 local_198 [16];
  ChVector<double> local_188;
  undefined1 local_168 [128];
  double local_e8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [128];
  double local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_310 = mesh;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ::clear(&this->beam_elems);
  this_01 = &this->beam_nodes;
  local_1e8 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_01);
  peVar1 = (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  dVar60 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20 -
           *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
  auVar16 = vsubpd_avx(*(undefined1 (*) [16])&peVar1->field_0x28,
                       *(undefined1 (*) [16])&peVar2->field_0x28);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  if ((dVar60 != 0.0) || (NAN(dVar60))) {
LAB_005e03ab:
    dVar48 = auVar16._0_8_;
    auVar16 = vshufpd_avx(auVar16,auVar16,1);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar48 * dVar48;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar60;
    auVar15 = vfmadd231sd_fma(auVar17,auVar42,auVar42);
    auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    bVar9 = 2.2250738585072014e-308 <= auVar15._0_8_;
    dVar53 = 1.0 / auVar15._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (ulong)bVar9 * (long)(auVar16._0_8_ * dVar53);
    local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)((ulong)bVar9 * (long)(dVar48 * dVar53));
    auVar16._0_8_ = (ulong)bVar9 * (long)(dVar60 * dVar53) + (ulong)!bVar9 * 0x3ff0000000000000;
    auVar16._8_8_ = 0;
  }
  else {
    uVar14 = vcmppd_avx512vl(auVar16,ZEXT816(0) << 0x40,0);
    if (((uVar14 & 1) == 0) || ((uVar14 & 3) >> 1 == 0)) goto LAB_005e03ab;
    auVar16 = ZEXT816(0x3ff0000000000000);
    auVar15 = ZEXT816(0) << 0x40;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = Ydir->m_data[2];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = Ydir->m_data[0];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = Ydir->m_data[1];
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar16._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar15._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       Ydir->m_data[2] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar17 = vfmsub231sd_fma(auVar54,auVar15,auVar68);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       Ydir->m_data[1] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar42 = vfmsub231sd_fma(auVar49,auVar10,auVar61);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar42._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       Ydir->m_data[0] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar43 = vfmsub231sd_fma(auVar43,auVar16,auVar64);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar43._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar17._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar17 = vfmadd231sd_fma(auVar71,auVar42,auVar42);
  auVar17 = vfmadd231sd_fma(auVar17,auVar43,auVar43);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar60 = auVar17._0_8_;
  if (0.0001 <= dVar60) goto LAB_005e04fe;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar17 = vandpd_avx512vl(auVar68,auVar6);
  if (0.9 <= auVar17._0_8_) {
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar17 = vandpd_avx512vl(auVar64,auVar7);
    if (0.9 <= auVar17._0_8_) {
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar17 = vandpd_avx512vl(auVar61,auVar8);
      auVar42 = ZEXT816(0);
      if (0.9 <= auVar17._0_8_) goto LAB_005e04c8;
      auVar17 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar42 = ZEXT816(0x3ff0000000000000);
LAB_005e04c8:
      auVar17 = ZEXT816(0);
    }
    auVar43 = ZEXT816(0);
  }
  else {
    auVar43 = ZEXT816(0x3ff0000000000000);
    auVar17 = ZEXT816(0);
    auVar42 = ZEXT816(0);
  }
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       auVar17._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar49 = vfmadd231sd_fma(auVar55,auVar15,auVar43);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       auVar42._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar17 = vfmadd231sd_fma(auVar50,auVar10,auVar17);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar17._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       auVar43._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar42 = vfmadd231sd_fma(auVar44,auVar16,auVar42);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar42._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar49._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar17 = vfmadd231sd_fma(auVar62,auVar17,auVar17);
  auVar17 = vfmadd231sd_fma(auVar17,auVar42,auVar42);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar60 = auVar17._0_8_;
LAB_005e04fe:
  dVar60 = 1.0 / dVar60;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar60;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar60;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar60;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar15 = vfmsub231sd_fma(auVar63,auVar56,auVar15);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar16 = vfmsub231sd_fma(auVar65,auVar45,auVar16);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar17 = vfmsub231sd_fma(auVar69,auVar51,auVar10);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar15._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar16._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar17._0_8_;
  local_320 = nodeB;
  local_318 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_01,nodeA);
  if (0 < N) {
    local_1f0 = (double)N;
    uVar14 = 1;
    local_208 = &(local_320->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount;
    local_1f8 = (ulong)(uint)N;
    local_200 = (ulong)(N + 1);
    local_210 = (element_type *)&PTR__ChFrame_00b03780;
    do {
      dVar60 = (double)(int)uVar14 / local_1f0;
      peVar1 = (local_318->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar12 = (local_320->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_188.m_data[2] = *(double *)&peVar1->field_0x30;
      auVar16 = *(undefined1 (*) [16])&(peVar1->super_ChNodeFEAbase).field_0x20;
      auVar15 = vsubpd_avx(*(undefined1 (*) [16])&(pCVar12->super_ChNodeFEAbase).field_0x20,auVar16)
      ;
      local_188.m_data[0] = auVar16._0_8_ + dVar60 * auVar15._0_8_;
      local_188.m_data[1] = auVar16._8_8_ + dVar60 * auVar15._8_8_;
      local_188.m_data[2] =
           local_188.m_data[2] + dVar60 * (*(double *)&pCVar12->field_0x30 - local_188.m_data[2]);
      local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (uVar14 < local_1f8) {
        mv = &local_188;
        ChFrame<double>::ChFrame((ChFrame<double> *)local_b8,mv,&local_1e0);
        pCVar12 = (ChNodeFEAxyzrot *)
                  ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
        local_168._0_8_ = local_210;
        local_168._8_8_ = local_b8._8_8_;
        local_168._16_8_ = local_b8._16_8_;
        local_168._24_8_ = local_b8._24_8_;
        local_168._32_8_ = local_b8._32_8_;
        local_168._40_8_ = local_b8._40_8_;
        local_168._48_8_ = local_b8._48_8_;
        local_168._56_8_ = local_b8._56_8_;
        local_e8 = local_38;
        local_168._64_64_ = local_b8._64_64_;
        ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar12,(ChFrame<double> *)local_168);
        local_338 = pCVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::fea::ChNodeFEAxyzrot*>(a_Stack_330,pCVar12);
        _Var11._M_pi = a_Stack_330[0]._M_pi;
        local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_338;
        this_00._M_pi =
             local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_338 = (ChNodeFEAxyzrot *)0x0;
        a_Stack_330[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var11._M_pi;
        if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
           a_Stack_330[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_330[0]._M_pi);
        }
        pCVar3 = (local_310->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_258.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = &(local_348.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase;
        if (local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_348.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_348.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_258.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        ChMesh::AddNode(pCVar3,&local_258);
        if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_258.
                     super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = pCVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_348.
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,local_208);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_01,&local_348);
      local_168._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamEuler,std::allocator<chrono::fea::ChElementBeamEuler>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8),
                 (ChElementBeamEuler **)local_168,
                 (allocator<chrono::fea::ChElementBeamEuler> *)local_b8);
      pCVar3 = (local_310->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_168._0_8_;
      local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar3,&local_228);
      if (local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
      ::push_back(&local_1e8->beam_elems,(value_type *)local_168);
      psVar13 = (this_01->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_238 = psVar13[uVar14 - 1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      p_Stack_230 = psVar13[uVar14 - 1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      p_Var4 = psVar13[uVar14 - 1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
          psVar13 = (this_01->
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      local_248 = psVar13[uVar14].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      p_Stack_240 = psVar13[uVar14].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      p_Var4 = psVar13[uVar14].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      (*(*(_func_int ***)local_168._0_8_)[0x1a])(local_168._0_8_,&local_238,&local_248);
      if (p_Stack_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_240);
      }
      if (p_Stack_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_230);
      }
      auVar66._8_8_ = 0;
      auVar66._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar57._8_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar57._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar72._8_8_ = 0;
      auVar72._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      dVar60 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] +
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
      if (0.0 <= dVar60) {
        dVar60 = dVar60 + 1.0;
        if (dVar60 < 0.0) {
          local_288._0_16_ = auVar57;
          local_2a8._0_16_ = auVar66;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar72;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar29._0_8_ = sqrt(dVar60);
          auVar29._8_56_ = extraout_var;
          auVar16 = auVar29._0_16_;
          auVar72 = local_2e8._0_16_;
          dVar60 = (double)local_308._0_8_;
          auVar66 = local_2a8._0_16_;
          auVar57 = local_288._0_16_;
          dVar48 = (double)local_2c8._0_8_;
        }
        else {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar60;
          auVar16 = vsqrtsd_avx(auVar21,auVar21);
          dVar60 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar48 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar46._8_8_ = 0x3fe0000000000000;
        auVar46._0_8_ = 0x3fe0000000000000;
        auVar15 = vunpcklpd_avx(auVar72,auVar66);
        auVar15 = vsubpd_avx(auVar15,auVar57);
        auVar33._0_8_ = 0.5 / auVar16._0_8_;
        auVar33._8_8_ = auVar33._0_8_;
        auVar41 = ZEXT1632(CONCAT88(auVar15._8_8_ * auVar33._0_8_,auVar15._0_8_ * auVar33._0_8_));
        auVar34 = vunpcklpd_avx(auVar46,auVar33);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar60 - dVar48;
        auVar25 = vunpcklpd_avx(auVar16,auVar35);
      }
      else if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] <= local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[0]) {
        if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] <
            local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        goto LAB_005e09a4;
        dVar60 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8]) + 1.0;
        if (dVar60 < 0.0) {
          local_288._0_16_ = auVar57;
          local_2a8._0_16_ = auVar66;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar72;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar32._0_8_ = sqrt(dVar60);
          auVar32._8_56_ = extraout_var_02;
          auVar16 = auVar32._0_16_;
          dVar60 = (double)local_308._0_8_;
          auVar72 = local_2e8._0_16_;
          dVar48 = (double)local_2a8._0_8_;
          auVar57 = local_288._0_16_;
          dVar53 = (double)local_2c8._0_8_;
        }
        else {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar60;
          auVar16 = vsqrtsd_avx(auVar23,auVar23);
          dVar60 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar48 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
          dVar53 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar34._0_8_ = 0.5 / auVar16._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar53 + dVar60;
        auVar16 = vunpcklpd_avx(auVar16,auVar39);
        auVar40._8_8_ = 0x3fe0000000000000;
        auVar40._0_8_ = 0x3fe0000000000000;
        auVar34._8_8_ = auVar34._0_8_;
        auVar15 = vunpcklpd_avx(auVar40,auVar34);
        auVar41 = ZEXT1632(CONCAT88(auVar16._8_8_ * auVar15._8_8_,auVar16._0_8_ * auVar15._0_8_));
        auVar16 = vsubpd_avx(auVar72,auVar57);
        auVar25._8_8_ = dVar48 + auVar57._8_8_;
        auVar25._0_8_ = auVar16._0_8_;
      }
      else if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] < local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]) {
LAB_005e09a4:
        dVar60 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4]) + 1.0;
        if (dVar60 < 0.0) {
          local_288._0_16_ = auVar57;
          local_2a8._0_16_ = auVar66;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar72;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar30._0_8_ = sqrt(dVar60);
          auVar30._8_56_ = extraout_var_00;
          auVar16 = auVar30._0_16_;
          auVar72 = local_2e8._0_16_;
          dVar60 = (double)local_308._0_8_;
          auVar66 = local_2a8._0_16_;
          auVar57 = local_288._0_16_;
          dVar48 = (double)local_2c8._0_8_;
        }
        else {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar60;
          auVar16 = vsqrtsd_avx(auVar22,auVar22);
          dVar60 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar48 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar17 = vunpcklpd_avx(auVar66,auVar72);
        auVar15 = vshufpd_avx(auVar57,auVar57,1);
        auVar34._0_8_ = 0.5 / auVar16._0_8_;
        auVar41 = ZEXT1632(CONCAT88((auVar15._8_8_ + auVar17._8_8_) * auVar34._0_8_,
                                    (auVar15._0_8_ + auVar17._0_8_) * auVar34._0_8_));
        auVar34._8_8_ = 0x3fe0000000000000;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar60 - dVar48;
        auVar25 = vunpcklpd_avx(auVar36,auVar16);
      }
      else {
        dVar60 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0]) + 1.0;
        if (dVar60 < 0.0) {
          local_288._0_16_ = auVar57;
          local_2a8._0_16_ = auVar66;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar72;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar31._0_8_ = sqrt(dVar60);
          auVar31._8_56_ = extraout_var_01;
          auVar16 = auVar31._0_16_;
          dVar60 = (double)local_308._0_8_;
          auVar72 = local_2e8._0_16_;
          dVar48 = (double)local_2a8._0_8_;
          auVar57 = local_288._0_16_;
          dVar53 = (double)local_2c8._0_8_;
        }
        else {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar60;
          auVar16 = vsqrtsd_avx(auVar20,auVar20);
          dVar60 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar48 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
          dVar53 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar34._0_8_ = 0.5 / auVar16._0_8_;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar53 + dVar60;
        auVar16 = vunpcklpd_avx(auVar37,auVar16);
        auVar34._8_8_ = auVar34._0_8_;
        auVar41 = ZEXT1632(CONCAT88(auVar16._8_8_ * 0.5,auVar16._0_8_ * auVar34._0_8_));
        auVar24._8_8_ = dVar48;
        auVar24._0_8_ = dVar48;
        auVar38._0_8_ = auVar72._0_8_ + auVar57._0_8_;
        auVar38._8_8_ = auVar72._8_8_ + auVar57._8_8_;
        auVar16 = vsubpd_avx(auVar24,auVar57);
        auVar25 = vshufpd_avx(auVar16,auVar38,1);
      }
      auVar16 = auVar41._0_16_;
      auVar58._0_8_ = auVar25._0_8_ * auVar34._0_8_;
      auVar58._8_8_ = auVar25._8_8_ * auVar34._8_8_;
      p_Var5 = *((element_type *)(local_168._0_8_ + 0xb8))->_vptr_ChElementBase;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((element_type *)(local_168._0_8_ + 0xb8))->_vptr_ChElementBase[1];
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      auVar15 = vshufpd_avx(auVar58,auVar58,1);
      auVar47._24_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar47._16_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar73._8_8_ = auVar58._0_8_;
      auVar73._0_8_ = auVar58._0_8_;
      auVar73._16_8_ = auVar58._0_8_;
      auVar73._24_8_ = auVar58._0_8_;
      auVar67._0_8_ = auVar41._0_8_ ^ 0x8000000000000000;
      auVar67._8_8_ = auVar41._8_8_ ^ 0x8000000000000000;
      uVar19 = auVar15._0_8_ ^ 0x8000000000000000;
      auVar28 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x48)),0x15);
      auVar15 = vunpcklpd_avx(auVar16,auVar67);
      auVar17 = vshufpd_avx(auVar67,auVar67,1);
      auVar70._8_8_ = uVar19;
      auVar70._0_8_ = uVar19;
      auVar70._16_8_ = uVar19;
      auVar70._24_8_ = uVar19;
      auVar18._16_16_ = auVar17;
      auVar18._0_16_ = auVar15;
      auVar18 = vblendpd_avx(auVar18,auVar70,8);
      auVar47._8_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar47._0_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar59 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x38)),1);
      auVar26._0_8_ = auVar18._0_8_ * auVar59._0_8_;
      auVar26._8_8_ = auVar18._8_8_ * auVar59._8_8_;
      auVar26._16_8_ = auVar18._16_8_ * auVar59._16_8_;
      auVar26._24_8_ = auVar18._24_8_ * auVar59._24_8_;
      auVar42 = vfmadd231pd_fma(auVar26,auVar73,*(undefined1 (*) [32])(p_Var5 + 0x38));
      auVar18 = vpermpd_avx2(auVar41,0x55);
      auVar59 = ZEXT1632(auVar58);
      auVar18 = vblendpd_avx(auVar18,auVar59,2);
      auVar18 = vblendpd_avx(auVar18,auVar70,4);
      auVar42 = vfmadd213pd_fma(auVar47,auVar18,ZEXT1632(auVar42));
      auVar18 = vpermt2pd_avx512f(_DAT_0096b5c0,auVar59);
      auVar42 = vfmadd213pd_fma(auVar18,auVar28,ZEXT1632(auVar42));
      *(undefined1 (*) [32])(local_168._0_8_ + 0x110) = ZEXT1632(auVar42);
      auVar18 = ZEXT1632(auVar67);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_2c8 = ZEXT1632(auVar67);
        local_308 = ZEXT1632(auVar15);
        local_2e8 = auVar70;
        local_2a8 = auVar59;
        local_288 = auVar41;
        local_198 = auVar17;
        local_d8 = auVar73;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        auVar15 = local_308._0_16_;
        auVar58 = local_2a8._0_16_;
        auVar16 = local_288._0_16_;
        auVar70 = local_2e8;
        auVar17 = local_198;
        auVar73 = local_d8;
        auVar18 = local_2c8;
      }
      p_Var5 = ((element_type *)(local_168._0_8_ + 0xb8))->_vptr_ChElementBase[2];
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((element_type *)(local_168._0_8_ + 0xb8))->_vptr_ChElementBase[3];
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      auVar41._16_16_ = auVar17;
      auVar41._0_16_ = auVar15;
      auVar52._8_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar52._0_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar41 = vblendpd_avx(auVar41,auVar70,8);
      auVar28 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x38)),1);
      auVar59 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x48)),0x15);
      auVar27._0_8_ = auVar41._0_8_ * auVar28._0_8_;
      auVar27._8_8_ = auVar41._8_8_ * auVar28._8_8_;
      auVar27._16_8_ = auVar41._16_8_ * auVar28._16_8_;
      auVar27._24_8_ = auVar41._24_8_ * auVar28._24_8_;
      auVar17 = vfmadd231pd_fma(auVar27,auVar73,*(undefined1 (*) [32])(p_Var5 + 0x38));
      auVar15 = vunpckhpd_avx(auVar16,auVar58);
      auVar52._24_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar52._16_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar41 = vblendpd_avx(ZEXT1632(auVar15),auVar70,4);
      auVar41 = vpermpd_avx2(auVar41,0x24);
      auVar17 = vfmadd213pd_fma(auVar52,auVar41,ZEXT1632(auVar17));
      auVar28._16_16_ = auVar16;
      auVar28._0_16_ = auVar15;
      auVar41 = vpermpd_avx2(auVar18,0x11);
      auVar41 = vshufpd_avx(auVar28,auVar41,9);
      auVar16 = vfmadd213pd_fma(auVar41,auVar59,ZEXT1632(auVar17));
      *(undefined1 (*) [32])(local_168._0_8_ + 0x130) = ZEXT1632(auVar16);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      local_268 = (sect->
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      local_260._M_pi =
           (sect->super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)(local_168._0_8_ + 0xd0))->_vptr_ChElementBase = (_func_int **)local_268;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._0_8_ + 0xd8),&local_260);
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      }
      if (local_348.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_348.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_200);
  }
  return;
}

Assistant:

void ChBuilderBeamEuler::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionEuler> sect,     // section material for beam elements
                                   const int N,                                  // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,       // starting point
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeB,       // ending point
                                   const ChVector<> Ydir                         // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(nodeB->Frame().GetPos() - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (nodeB->Frame().GetPos() - nodeA->Frame().GetPos()) * eta;

        std::shared_ptr<ChNodeFEAxyzrot> nodeBi;
        if (i < N) {
            nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
            mesh->AddNode(nodeBi);
        } else
            nodeBi = nodeB;  // last node: use the one passed as parameter.

        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());

        element->SetSection(sect);
    }
}